

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedate.c
# Opt level: O0

_Bool match_time(char *date,int *h,int *m,int *s,char **endp)

{
  int iVar1;
  int iVar2;
  int local_4c;
  int ss;
  int mm;
  int hh;
  char *p;
  char **endp_local;
  int *s_local;
  int *m_local;
  int *h_local;
  char *date_local;
  
  local_4c = 0;
  p = (char *)endp;
  endp_local = (char **)s;
  s_local = m;
  m_local = h;
  h_local = (int *)date;
  iVar1 = oneortwodigit(date,(char **)&mm);
  if (((((iVar1 < 0x18) && (*_mm == ':')) && ('/' < _mm[1])) &&
      ((_mm[1] < ':' && (iVar2 = oneortwodigit(_mm + 1,(char **)&mm), iVar2 < 0x3c)))) &&
     (((*_mm != ':' || ((_mm[1] < '0' || ('9' < _mm[1])))) ||
      (local_4c = oneortwodigit(_mm + 1,(char **)&mm), local_4c < 0x3d)))) {
    *m_local = iVar1;
    *s_local = iVar2;
    *(int *)endp_local = local_4c;
    *(char **)p = _mm;
    date_local._7_1_ = true;
  }
  else {
    date_local._7_1_ = false;
  }
  return date_local._7_1_;
}

Assistant:

static bool match_time(const char *date,
                       int *h, int *m, int *s, char **endp)
{
  const char *p;
  int hh, mm, ss = 0;
  hh = oneortwodigit(date, &p);
  if((hh < 24) && (*p == ':') && ISDIGIT(p[1])) {
    mm = oneortwodigit(&p[1], &p);
    if(mm < 60) {
      if((*p == ':') && ISDIGIT(p[1])) {
        ss = oneortwodigit(&p[1], &p);
        if(ss <= 60) {
          /* valid HH:MM:SS */
          goto match;
        }
      }
      else {
        /* valid HH:MM */
        goto match;
      }
    }
  }
  return FALSE; /* not a time string */
match:
  *h = hh;
  *m = mm;
  *s = ss;
  *endp = (char *)CURL_UNCONST(p);
  return TRUE;
}